

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalNinjaGenerator::WriteDyndepFile
          (cmGlobalNinjaGenerator *this,string *dir_top_src,string *dir_top_bld,string *dir_cur_src,
          string *dir_cur_bld,string *arg_dd,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_ddis,string *module_dir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *linked_target_dirs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *forward_modules_from_target_dirs,string *arg_lang,string *arg_modmapfmt,
          cmCxxModuleExportInfo *export_info)

{
  cmSourceReqInfo *__k;
  _Rb_tree_color _Var1;
  cmake *pcVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  cmSourceReqInfo *pcVar5;
  pointer pcVar6;
  CxxModuleMapFormat format;
  char cVar7;
  size_type sVar8;
  pointer pcVar9;
  bool bVar10;
  bool bVar11;
  Value *pVVar12;
  Value *pVVar13;
  Value *pVVar14;
  iterator iVar15;
  _Link_type __z;
  uchar *puVar16;
  iterator __x;
  mapped_type *this_00;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_01;
  mapped_type *pmVar17;
  string *psVar18;
  _Rb_tree_node_base *p_Var19;
  _Base_ptr p_Var20;
  Value *pVVar21;
  pointer pcVar22;
  undefined4 uVar23;
  char *pcVar24;
  Value *source;
  Value *source_00;
  Value *source_01;
  long lVar25;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar26;
  cmSourceReqInfo *p;
  pointer pcVar27;
  pointer pcVar28;
  int iVar29;
  const_iterator cVar30;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar31;
  string_view separator;
  string fmftn;
  string target_mods_file;
  string ltmn;
  vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> objects;
  Value target_module_info;
  Value target_modules;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
  mod_files;
  static_string_view module_ext;
  undefined1 local_708 [32];
  Value ltm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_6a8 [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_690 [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_648 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_618;
  CxxModuleUsage usages;
  String local_568;
  cmGeneratedFileStream tmf;
  string local_2e0;
  cmGeneratedFileStream ddf;
  _Any_data __tmp_1;
  _Any_data __tmp_2;
  
  pcVar2 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
       (pcVar2->CurrentSnapshot).Position.Position;
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)(pcVar2->CurrentSnapshot).State;
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (pcVar2->CurrentSnapshot).Position.Tree;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&ddf,(cmStateSnapshot *)&tmf);
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)&ddf,dir_cur_src);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&ddf,(cmStateSnapshot *)&tmf);
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)&ddf,dir_cur_bld);
  ltm.value_ = (ValueHolder)this;
  std::make_unique<cmMakefile,cmGlobalNinjaGenerator*,cmStateSnapshot&>
            ((cmGlobalNinjaGenerator **)&ddf,(cmStateSnapshot *)&ltm);
  (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[2])
            (&ltm,this,
             ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
             _vptr_basic_ostream);
  cmOutputConverter::SetRelativePathTop
            ((cmOutputConverter *)ltm.value_.map_,dir_top_src,dir_top_bld);
  std::
  vector<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>,std::allocator<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>>>
  ::emplace_back<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>>
            ((vector<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>,std::allocator<std::unique_ptr<cmMakefile,std::default_delete<cmMakefile>>>>
              *)&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.Makefiles,
             (unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)&ddf);
  std::
  vector<std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>,std::allocator<std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>>>
  ::emplace_back<std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>>
            ((vector<std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>,std::allocator<std::unique_ptr<cmLocalGenerator,std::default_delete<cmLocalGenerator>>>>
              *)&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators,
             (unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *)&ltm);
  if (ltm.value_.int_ != 0) {
    (**(code **)(*(long *)ltm.value_.string_ + 8))();
  }
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr
            ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)&ddf);
  objects.super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects.super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  objects.super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar18 = (arg_ddis->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (arg_ddis->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (psVar18 == psVar3) {
      usages.Usage._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &usages.Usage._M_t._M_impl.super__Rb_tree_header._M_header;
      usages.Usage._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      usages.Usage._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      usages.Usage._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      usages.Reference._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &usages.Reference._M_t._M_impl.super__Rb_tree_header._M_header;
      usages.Reference._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      usages.Reference._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      usages.Reference._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &mod_files._M_t._M_impl.super__Rb_tree_header._M_header;
      mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      mod_files._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pbVar26 = (linked_target_dirs->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar4 = (linked_target_dirs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           mod_files._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      usages.Usage._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           usages.Usage._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      usages.Reference._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           usages.Reference._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      goto LAB_0026790b;
    }
    ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
    ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_1_ = 0;
    ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._80_8_ = 0;
    ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._88_8_ = 0;
    ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._64_8_ = 0;
    ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._72_8_ = 0;
    ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._48_8_ = 0;
    ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._56_8_ = 0;
    ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ = 0;
    ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ = 0;
    ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._96_8_ = 0;
    ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)
         &ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
    bVar10 = cmScanDepFormat_P1689_Parse(psVar18,(cmScanDepInfo *)&ddf);
    if (bVar10) {
      std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>::emplace_back<cmScanDepInfo>
                (&objects,(cmScanDepInfo *)&ddf);
    }
    else {
      cmStrCat<char_const(&)[48],std::__cxx11::string_const&>
                ((string *)&tmf,(char (*) [48])"-E cmake_ninja_dyndep failed to parse ddi file ",
                 psVar18);
      cmSystemTools::Error((string *)&tmf);
      std::__cxx11::string::~string((string *)&tmf);
    }
    cmScanDepInfo::~cmScanDepInfo((cmScanDepInfo *)&ddf);
    psVar18 = psVar18 + 1;
  } while (bVar10);
  bVar10 = false;
  goto LAB_00268cce;
LAB_0026790b:
  if (pbVar26 != pbVar4) {
    ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)
         CONCAT71(ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                  _vptr_basic_ostream._1_7_,0x2f);
    cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&,char_const(&)[13]>
              (&ltmn,pbVar26,(char *)&ddf,arg_lang,(char (*) [13])"Modules.json");
    Json::Value::Value(&ltm,nullValue);
    std::ifstream::ifstream(&ddf,ltmn._M_dataplus._M_p,_S_in|_S_bin);
    if (((&ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [(long)ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                _vptr_basic_ostream[-3]] & 5) == 0) goto LAB_00267982;
    cmStrCat<char_const(&)[38],std::__cxx11::string_const&,char_const(&)[24]>
              ((string *)&tmf,(char (*) [38])"-E cmake_ninja_dyndep failed to open ",&ltmn,
               (char (*) [24])" for module information");
    cmSystemTools::Error((string *)&tmf);
    std::__cxx11::string::~string((string *)&tmf);
    std::ifstream::~ifstream(&ddf);
    Json::Value::~Value(&ltm);
    psVar18 = &ltmn;
LAB_00268000:
    std::__cxx11::string::~string((string *)psVar18);
    goto LAB_00268005;
  }
  format = Clang;
  if (arg_modmapfmt->_M_string_length == 0) {
    lVar25 = 0;
  }
  else {
    bVar10 = std::operator==(arg_modmapfmt,"clang");
    lVar25 = 1;
    if (!bVar10) {
      bVar10 = std::operator==(arg_modmapfmt,"gcc");
      if (bVar10) {
        format = Gcc;
      }
      else {
        bVar10 = std::operator==(arg_modmapfmt,"msvc");
        if (!bVar10) {
          cmStrCat<char_const(&)[47],std::__cxx11::string_const&,char_const(&)[19]>
                    ((string *)&ddf,(char (*) [47])"-E cmake_ninja_dyndep does not understand the ",
                     arg_modmapfmt,(char (*) [19])" module map format");
          cmSystemTools::Error((string *)&ddf);
          psVar18 = (string *)&ddf;
          goto LAB_00268000;
        }
        format = Msvc;
      }
    }
  }
  module_ext = CxxModuleMapExtension((optional<CxxModuleMapFormat>)((ulong)format | lVar25 << 0x20))
  ;
  Json::Value::Value(&target_modules,objectValue);
  pcVar9 = objects.super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pcVar28 = objects.super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>._M_impl.
                 super__Vector_impl_data._M_start; pcVar28 != pcVar9; pcVar28 = pcVar28 + 1) {
    pcVar5 = (pcVar28->Provides).
             super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (psVar18 = &((pcVar28->Provides).
                     super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
                     super__Vector_impl_data._M_start)->CompiledModulePath;
        __k = (cmSourceReqInfo *)(psVar18 + -2), __k != pcVar5;
        psVar18 = (string *)((long)(psVar18 + 3) + 8)) {
      tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           &tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
      tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
      tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
           tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ &
           0xffffffffffffff00;
      bVar10 = cmDyndepCollation::IsBmiOnly(export_info,&pcVar28->PrimaryOutput);
      if (bVar10) {
        std::__cxx11::string::_M_assign((string *)&tmf);
      }
      else {
        if (psVar18->_M_string_length == 0) {
          std::__cxx11::string::string((string *)&ddf,(string *)__k);
          cmsys::SystemTools::ReplaceString((string *)&ddf,":","-");
          cmStrCat<std::__cxx11::string_const&,std::__cxx11::string&,cm::static_string_view&>
                    ((string *)&ltm,module_dir,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ddf,
                     &module_ext);
          std::__cxx11::string::operator=((string *)&tmf,(string *)&ltm);
          std::__cxx11::string::~string((string *)&ltm);
        }
        else {
          std::__cxx11::string::_M_assign((string *)&tmf);
          bVar10 = cmsys::SystemTools::FileIsFullPath((string *)&tmf);
          if (bVar10) goto LAB_00268196;
          cmsys::SystemTools::CollapseFullPath((string *)&ddf,(string *)&tmf,dir_top_bld);
          std::__cxx11::string::operator=((string *)&tmf,(string *)&ddf);
        }
        std::__cxx11::string::~string((string *)&ddf);
      }
LAB_00268196:
      std::__cxx11::string::string((string *)&ddf,(string *)&tmf);
      ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
           ddf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ &
           0xffffffffffffff00;
      pmVar17 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                ::operator[](&mod_files,(key_type *)__k);
      WriteDyndepFile::AvailableModuleInfo::operator=(pmVar17,(AvailableModuleInfo *)&ddf);
      std::__cxx11::string::~string((string *)&ddf);
      Json::Value::Value((Value *)&ddf,objectValue);
      pVVar12 = Json::Value::operator[](&target_modules,(String *)__k);
      pVVar12 = Json::Value::operator=(pVVar12,(Value *)&ddf);
      Json::Value::~Value((Value *)&ddf);
      Json::Value::Value((Value *)&ddf,(string *)&tmf);
      pVVar13 = Json::Value::operator[](pVVar12,"bmi");
      Json::Value::operator=(pVVar13,(Value *)&ddf);
      Json::Value::~Value((Value *)&ddf);
      bVar10 = cmDyndepCollation::IsObjectPrivate(&pcVar28->PrimaryOutput,export_info);
      Json::Value::Value((Value *)&ddf,bVar10);
      pVVar12 = Json::Value::operator[](pVVar12,"is-private");
      Json::Value::operator=(pVVar12,(Value *)&ddf);
      Json::Value::~Value((Value *)&ddf);
      std::__cxx11::string::~string((string *)&tmf);
    }
  }
  cmGeneratedFileStream::cmGeneratedFileStream(&ddf,arg_dd,false,None);
  std::operator<<((ostream *)&ddf,"ninja_dyndep_version = 1.0\n");
  target_module_info.value_.string_ = (char *)&target_module_info.comments_;
  target_module_info.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
  target_module_info._12_4_ = 0;
  target_module_info.comments_.ptr_._M_t.
  super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
  .
  super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  ._M_head_impl._0_1_ = 0;
  target_module_info.limit_ = 0;
  std::__cxx11::string::assign((char *)&target_module_info);
  ltm.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
  ltm._12_4_ = 0;
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)target_module_info.limit_;
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = 0;
  target_module_info.limit_ = (ptrdiff_t)this;
  ltm.value_ = (ValueHolder)this;
  std::_Function_base::~_Function_base((_Function_base *)&tmf);
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)0x0;
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
  tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = 0;
  std::_Function_base::~_Function_base((_Function_base *)&tmf);
  if ((char)lVar25 == '\0') {
LAB_00268475:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"dyndep",(allocator<char> *)&tmf);
    cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)&ltm,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[1]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_6a8,
               (char (*) [1])0x6e9b79);
    pcVar9 = objects.super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pcVar28 = objects.super__Vector_base<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>._M_impl
                   .super__Vector_impl_data._M_start; pcVar28 != pcVar9; pcVar28 = pcVar28 + 1) {
      ConvertToNinjaPath(this,&pcVar28->PrimaryOutput);
      std::__cxx11::string::_M_assign((string *)local_6a8[0]);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(local_690);
      pcVar6 = (pcVar28->Provides).
               super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pcVar27 = (pcVar28->Provides).
                     super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
                     super__Vector_impl_data._M_start; pcVar27 != pcVar6; pcVar27 = pcVar27 + 1) {
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                  ::operator[](&mod_files,&pcVar27->LogicalName);
        psVar18 = ConvertToNinjaPath(this,&pmVar17->BmiPath);
        std::__cxx11::string::string((string *)&tmf,(string *)psVar18);
        bVar10 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&tmf,local_6a8[0]);
        if (bVar10) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_690,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmf);
        }
        std::__cxx11::string::~string((string *)&tmf);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(local_648);
      pcVar6 = (pcVar28->Requires).
               super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pcVar27 = (pcVar28->Requires).
                     super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>._M_impl.
                     super__Vector_impl_data._M_start; pcVar27 != pcVar6; pcVar27 = pcVar27 + 1) {
        iVar15 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                 ::find(&mod_files,&pcVar27->LogicalName);
        if ((_Rb_tree_header *)iVar15._M_node != &mod_files._M_t._M_impl.super__Rb_tree_header) {
          psVar18 = ConvertToNinjaPath(this,(string *)(iVar15._M_node + 2));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_648,psVar18);
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::clear(&local_618);
      if ((pcVar28->Provides).super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (pcVar28->Provides).super__Vector_base<cmSourceReqInfo,_std::allocator<cmSourceReqInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<char_const(&)[7],char_const(&)[2]>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&local_618,(char (*) [7])"restat",(char (*) [2])0x6fbe28);
      }
      if ((char)lVar25 != '\0') {
        CxxModuleMapContent_abi_cxx11_
                  (&ltmn,format,(CxxModuleLocations *)&target_module_info,pcVar28,&usages);
        cmStrCat<std::__cxx11::string_const&,char_const(&)[8]>
                  (&target_mods_file,&pcVar28->PrimaryOutput,(char (*) [8])".modmap");
        cmGeneratedFileStream::cmGeneratedFileStream(&tmf,&target_mods_file,false,None);
        std::__cxx11::string::~string((string *)&target_mods_file);
        cmGeneratedFileStream::SetCopyIfDifferent(&tmf,true);
        std::operator<<((ostream *)&tmf,(string *)&ltmn);
        cmGeneratedFileStream::~cmGeneratedFileStream(&tmf);
        std::__cxx11::string::~string((string *)&ltmn);
      }
      WriteBuild(this,(ostream *)&ddf,(cmNinjaBuild *)&ltm,0,(bool *)0x0);
    }
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&ltm);
    CxxModuleLocations::~CxxModuleLocations((CxxModuleLocations *)&target_module_info);
    Json::Value::Value(&target_module_info,objectValue);
    pVVar12 = Json::Value::operator[](&target_module_info,"modules");
    Json::Value::operator=(pVVar12,&target_modules);
    Json::Value::Value((Value *)&tmf,objectValue);
    pVVar12 = Json::Value::operator[](&target_module_info,"usages");
    pVVar12 = Json::Value::operator=(pVVar12,(Value *)&tmf);
    Json::Value::~Value((Value *)&tmf);
    for (p_Var20 = usages.Usage._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var20 != &usages.Usage._M_t._M_impl.super__Rb_tree_header;
        p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20)) {
      Json::Value::Value((Value *)&tmf,arrayValue);
      pVVar13 = Json::Value::operator[](pVVar12,(String *)(p_Var20 + 1));
      pVVar13 = Json::Value::operator=(pVVar13,(Value *)&tmf);
      Json::Value::~Value((Value *)&tmf);
      for (p_Var19 = p_Var20[2]._M_right; p_Var19 != (_Rb_tree_node_base *)&p_Var20[2]._M_parent;
          p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19)) {
        Json::Value::Value((Value *)&tmf,(String *)(p_Var19 + 1));
        Json::Value::append(pVVar13,(Value *)&tmf);
        Json::Value::~Value((Value *)&tmf);
      }
    }
    Json::Value::Value((Value *)&tmf,objectValue);
    pVVar13 = Json::Value::operator[](&target_module_info,"references");
    pVVar13 = Json::Value::operator=(pVVar13,(Value *)&tmf);
    Json::Value::~Value((Value *)&tmf);
    for (p_Var20 = usages.Reference._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var20 != &usages.Reference._M_t._M_impl.super__Rb_tree_header;
        p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20)) {
      Json::Value::Value((Value *)&tmf,objectValue);
      pVVar14 = Json::Value::operator[](pVVar13,(String *)(p_Var20 + 1));
      pVVar14 = Json::Value::operator=(pVVar14,(Value *)&tmf);
      Json::Value::~Value((Value *)&tmf);
      Json::Value::Value((Value *)&tmf,(String *)(p_Var20 + 2));
      pVVar21 = Json::Value::operator[](pVVar14,"path");
      Json::Value::operator=(pVVar21,(Value *)&tmf);
      Json::Value::~Value((Value *)&tmf);
      _Var1 = p_Var20[3]._M_color;
      pcVar22 = (pointer)0x7;
      pcVar24 = "by-name";
      if (_Var1 != _S_red) {
        if (_Var1 == 2) {
          pcVar22 = (pointer)0xd;
          pcVar24 = "include-quote";
        }
        else {
          if (_Var1 != _S_black) {
            __assert_fail("false && \"unsupported lookup method\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGlobalNinjaGenerator.cxx"
                          ,0xb16,
                          "auto cmGlobalNinjaGenerator::WriteDyndepFile(const std::string &, const std::string &, const std::string &, const std::string &, const std::string &, const std::vector<std::string> &, const std::string &, const std::vector<std::string> &, const std::vector<std::string> &, const std::string &, const std::string &, const cmCxxModuleExportInfo &)::(anonymous class)::operator()(LookupMethod) const"
                         );
          }
          pcVar22 = (pointer)0xd;
          pcVar24 = "include-angle";
        }
      }
      ltmn._M_dataplus._M_p = pcVar22;
      ltmn._M_string_length = (size_type)pcVar24;
      std::__cxx11::string::string<cm::static_string_view,void>
                ((string *)&ltm,(static_string_view *)&ltmn,(allocator<char> *)&target_mods_file);
      Json::Value::Value((Value *)&tmf,(String *)&ltm);
      pVVar14 = Json::Value::operator[](pVVar14,"lookup-method");
      Json::Value::operator=(pVVar14,(Value *)&tmf);
      Json::Value::~Value((Value *)&tmf);
      std::__cxx11::string::~string((string *)&ltm);
    }
    cmsys::SystemTools::GetFilenamePath((string *)&tmf,arg_dd);
    ltm.value_.bool_ = true;
    pcVar24 = "Modules.json";
    cmStrCat<std::__cxx11::string,char,std::__cxx11::string_const&,char_const(&)[13]>
              (&target_mods_file,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmf,
               (char *)&ltm,arg_lang,(char (*) [13])"Modules.json");
    std::__cxx11::string::~string((string *)&tmf);
    pbVar4 = (forward_modules_from_target_dirs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar26 = (forward_modules_from_target_dirs->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; pbVar26 != pbVar4;
        pbVar26 = pbVar26 + 1) {
      tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           CONCAT71(tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                    _vptr_basic_ostream._1_7_,0x2f);
      pcVar24 = "Modules.json";
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&,char_const(&)[13]>
                (&fmftn,pbVar26,(char *)&tmf,arg_lang,(char (*) [13])"Modules.json");
      Json::Value::Value((Value *)&ltmn,nullValue);
      std::ifstream::ifstream((istream *)&tmf,fmftn._M_dataplus._M_p,_S_in|_S_bin);
      if (((&tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
           [(long)tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                  _vptr_basic_ostream[-3]] & 5) == 0) {
        Json::Reader::Reader((Reader *)&ltm);
        bVar10 = Json::Reader::parse((Reader *)&ltm,(istream *)&tmf,(Value *)&ltmn,false);
        if (bVar10) {
          bVar10 = Json::Value::isObject((Value *)&ltmn);
          iVar29 = 0x23;
          if (bVar10) {
            pVVar14 = Json::Value::operator[](&target_module_info,"modules");
            pVVar21 = Json::Value::operator[]((Value *)&ltmn,"modules");
            WriteDyndepFile::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)pVVar14,pVVar21,source);
            pVVar14 = Json::Value::operator[]((Value *)&ltmn,"references");
            WriteDyndepFile::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)pVVar13,pVVar14,source_00);
            pVVar14 = Json::Value::operator[]((Value *)&ltmn,"usages");
            iVar29 = 0;
            WriteDyndepFile::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)pVVar12,pVVar14,source_01);
          }
        }
        else {
          Json::Reader::getFormattedErrorMessages_abi_cxx11_(&local_568,(Reader *)&ltm);
          cmStrCat<char_const(&)[39],std::__cxx11::string_const&,std::__cxx11::string>
                    ((string *)local_708,(char (*) [39])"-E cmake_ninja_dyndep failed to parse ",
                     pbVar26,&local_568);
          cmSystemTools::Error((string *)local_708);
          std::__cxx11::string::~string((string *)local_708);
          std::__cxx11::string::~string((string *)&local_568);
          iVar29 = 1;
        }
        Json::Reader::~Reader((Reader *)&ltm);
      }
      else {
        cmStrCat<char_const(&)[38],std::__cxx11::string_const&,char_const(&)[24]>
                  ((string *)&ltm,(char (*) [38])"-E cmake_ninja_dyndep failed to open ",&fmftn,
                   (char (*) [24])" for module information");
        cmSystemTools::Error((string *)&ltm);
        std::__cxx11::string::~string((string *)&ltm);
        iVar29 = 1;
      }
      std::ifstream::~ifstream((istream *)&tmf);
      Json::Value::~Value((Value *)&ltmn);
      std::__cxx11::string::~string((string *)&fmftn);
      if ((iVar29 != 0x23) && (iVar29 != 0)) {
        bVar10 = false;
        goto LAB_00268c83;
      }
    }
    cmGeneratedFileStream::cmGeneratedFileStream(&tmf,&target_mods_file,false,None);
    cmGeneratedFileStream::SetCopyIfDifferent(&tmf,true);
    Json::operator<<((OStream *)&tmf,&target_module_info);
    fmftn.field_2._M_allocated_capacity = 0;
    fmftn.field_2._8_8_ = 0;
    fmftn._M_dataplus._M_p = (pointer)0x0;
    fmftn._M_string_length = 0;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
           *)&ltm,&mod_files);
    ltmn.field_2._M_allocated_capacity = 0;
    ltmn.field_2._8_8_ = 0;
    ltmn._M_dataplus._M_p = (pointer)0x0;
    ltmn._M_string_length = 0;
    pcVar22 = (pointer)operator_new(0x30);
    std::_Rb_tree_header::_Rb_tree_header
              ((_Rb_tree_header *)(pcVar22 + 8),(_Rb_tree_header *)&ltm.bits_);
    sVar8 = ltmn._M_string_length;
    ltmn.field_2._M_allocated_capacity = fmftn.field_2._M_allocated_capacity;
    ltmn._M_dataplus = fmftn._M_dataplus;
    ltmn._M_string_length = fmftn._M_string_length;
    fmftn._M_string_length = sVar8;
    fmftn.field_2._M_allocated_capacity =
         (size_type)
         std::
         _Function_handler<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGlobalNinjaGenerator.cxx:2905:5)>
         ::_M_manager;
    ltmn.field_2._8_8_ = fmftn.field_2._8_8_;
    fmftn.field_2._8_8_ =
         std::
         _Function_handler<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmGlobalNinjaGenerator.cxx:2905:5)>
         ::_M_invoke;
    fmftn._M_dataplus._M_p = pcVar22;
    std::_Function_base::~_Function_base((_Function_base *)&ltmn);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
            *)&ltm);
    bVar10 = cmDyndepCollation::WriteDyndepMetadata
                       ((cmDyndepCollation *)arg_lang,(string *)&objects,
                        (vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_> *)export_info,
                        (cmCxxModuleExportInfo *)&fmftn,(cmDyndepMetadataCallbacks *)pcVar24);
    std::_Function_base::~_Function_base((_Function_base *)&fmftn);
    cmGeneratedFileStream::~cmGeneratedFileStream(&tmf);
LAB_00268c83:
    std::__cxx11::string::~string((string *)&target_mods_file);
    Json::Value::~Value(&target_module_info);
  }
  else {
    target_mods_file._M_dataplus._M_p = target_mods_file._M_dataplus._M_p & 0xffffffffffffff00;
    CxxModuleUsageSeed_abi_cxx11_
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&tmf,(CxxModuleLocations *)&target_module_info,&objects,&usages,
               (bool *)&target_mods_file);
    if (tmf.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ == 0) {
      cVar7 = (char)target_mods_file._M_dataplus._M_p;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&tmf);
      if (cVar7 == '\0') goto LAB_00268475;
    }
    else {
      separator._M_str = "\", \"";
      separator._M_len = 4;
      cmJoin<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                (&ltmn,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&tmf,separator);
      fmftn._M_dataplus._M_p._0_1_ = 0x22;
      cmStrCat<char_const(&)[82],std::__cxx11::string,char>
                ((string *)&ltm,
                 (char (*) [82])
                 "Circular dependency detected in the C++ module import graph. See modules named: \""
                 ,&ltmn,(char *)&fmftn);
      cmSystemTools::Error((string *)&ltm);
      std::__cxx11::string::~string((string *)&ltm);
      std::__cxx11::string::~string((string *)&ltmn);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&tmf);
    }
    CxxModuleLocations::~CxxModuleLocations((CxxModuleLocations *)&target_module_info);
    bVar10 = false;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&ddf);
  Json::Value::~Value(&target_modules);
  goto LAB_00268cb4;
LAB_00267982:
  Json::Reader::Reader((Reader *)&tmf);
  bVar10 = Json::Reader::parse((Reader *)&tmf,(istream *)&ddf,&ltm,false);
  if (bVar10) {
    bVar11 = Json::Value::isObject(&ltm);
    if (bVar11) {
      pVVar12 = Json::Value::operator[](&ltm,"modules");
      bVar11 = Json::Value::isObject(pVVar12);
      if (bVar11) {
        cVar30 = Json::Value::begin(pVVar12);
        fmftn._M_dataplus._M_p = (pointer)cVar30.super_ValueIteratorBase.current_._M_node;
        fmftn._M_string_length =
             CONCAT71(fmftn._M_string_length._1_7_,cVar30.super_ValueIteratorBase.isNull_);
        while( true ) {
          cVar30 = Json::Value::end(pVVar12);
          target_module_info.value_.int_ =
               (LargestInt)cVar30.super_ValueIteratorBase.current_._M_node;
          target_module_info.bits_._0_1_ = cVar30.super_ValueIteratorBase.isNull_;
          bVar11 = Json::ValueIteratorBase::operator!=
                             ((ValueIteratorBase *)&fmftn,(SelfType *)&target_module_info);
          if (!bVar11) break;
          pVVar13 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&fmftn);
          bVar11 = Json::Value::isObject(pVVar13);
          if (bVar11) {
            pVVar14 = Json::Value::operator[](pVVar13,"bmi");
            pVVar13 = Json::Value::operator[](pVVar13,"is-private");
            Json::Value::asString_abi_cxx11_((String *)&target_module_info,pVVar14);
            bVar11 = Json::Value::asBool(pVVar13);
            target_module_info.limit_ = CONCAT71(target_module_info.limit_._1_7_,bVar11);
            Json::ValueIteratorBase::key(&target_modules,(ValueIteratorBase *)&fmftn);
            Json::Value::asString_abi_cxx11_(&target_mods_file,&target_modules);
            iVar15 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                     ::lower_bound(&mod_files,&target_mods_file);
            if (((_Rb_tree_header *)iVar15._M_node == &mod_files._M_t._M_impl.super__Rb_tree_header)
               || (bVar11 = std::operator<(&target_mods_file,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(iVar15._M_node + 1)), __x = iVar15, bVar11)) {
              __z = (_Link_type)operator_new(0x68);
              sVar8 = target_mods_file._M_string_length;
              puVar16 = (__z->_M_storage)._M_storage + 0x10;
              *(uchar **)(__z->_M_storage)._M_storage = puVar16;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)target_mods_file._M_dataplus._M_p == &target_mods_file.field_2) {
                *(ulong *)puVar16 =
                     CONCAT71(target_mods_file.field_2._M_allocated_capacity._1_7_,
                              target_mods_file.field_2._M_local_buf[0]);
                *(undefined8 *)((__z->_M_storage)._M_storage + 0x18) =
                     target_mods_file.field_2._8_8_;
              }
              else {
                *(pointer *)(__z->_M_storage)._M_storage = target_mods_file._M_dataplus._M_p;
                *(ulong *)puVar16 =
                     CONCAT71(target_mods_file.field_2._M_allocated_capacity._1_7_,
                              target_mods_file.field_2._M_local_buf[0]);
              }
              target_mods_file._M_string_length = 0;
              *(size_type *)((__z->_M_storage)._M_storage + 8) = sVar8;
              target_mods_file.field_2._M_local_buf[0] = '\0';
              (__z->_M_storage)._M_storage[0x30] = '\0';
              (__z->_M_storage)._M_storage[0x31] = '\0';
              (__z->_M_storage)._M_storage[0x32] = '\0';
              (__z->_M_storage)._M_storage[0x33] = '\0';
              (__z->_M_storage)._M_storage[0x34] = '\0';
              (__z->_M_storage)._M_storage[0x35] = '\0';
              (__z->_M_storage)._M_storage[0x36] = '\0';
              (__z->_M_storage)._M_storage[0x37] = '\0';
              (__z->_M_storage)._M_storage[0x38] = '\0';
              (__z->_M_storage)._M_storage[0x39] = '\0';
              (__z->_M_storage)._M_storage[0x3a] = '\0';
              (__z->_M_storage)._M_storage[0x3b] = '\0';
              (__z->_M_storage)._M_storage[0x3c] = '\0';
              (__z->_M_storage)._M_storage[0x3d] = '\0';
              (__z->_M_storage)._M_storage[0x3e] = '\0';
              (__z->_M_storage)._M_storage[0x3f] = '\0';
              (__z->_M_storage)._M_storage[0x40] = '\0';
              (__z->_M_storage)._M_storage[0x41] = '\0';
              (__z->_M_storage)._M_storage[0x42] = '\0';
              (__z->_M_storage)._M_storage[0x43] = '\0';
              (__z->_M_storage)._M_storage[0x44] = '\0';
              (__z->_M_storage)._M_storage[0x45] = '\0';
              (__z->_M_storage)._M_storage[0x46] = '\0';
              (__z->_M_storage)._M_storage[0x47] = '\0';
              *(uchar **)((__z->_M_storage)._M_storage + 0x20) = (__z->_M_storage)._M_storage + 0x30
              ;
              (__z->_M_storage)._M_storage[0x28] = '\0';
              (__z->_M_storage)._M_storage[0x29] = '\0';
              (__z->_M_storage)._M_storage[0x2a] = '\0';
              (__z->_M_storage)._M_storage[0x2b] = '\0';
              (__z->_M_storage)._M_storage[0x2c] = '\0';
              (__z->_M_storage)._M_storage[0x2d] = '\0';
              (__z->_M_storage)._M_storage[0x2e] = '\0';
              (__z->_M_storage)._M_storage[0x2f] = '\0';
              target_mods_file._M_dataplus._M_p = (pointer)&target_mods_file.field_2;
              pVar31 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                       ::_M_get_insert_hint_unique_pos
                                 (&mod_files._M_t,(const_iterator)iVar15._M_node,
                                  (key_type *)&__z->_M_storage);
              __x._M_node = pVar31.first;
              if (pVar31.second == (_Base_ptr)0x0) {
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                ::_M_drop_node((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                                *)__z,(_Link_type)iVar15._M_node);
              }
              else {
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
                ::_M_insert_node(&mod_files._M_t,__x._M_node,pVar31.second,__z);
                __x._M_node = (_Base_ptr)__z;
              }
            }
            WriteDyndepFile::AvailableModuleInfo::operator=
                      ((AvailableModuleInfo *)
                       ((((_Link_type)__x._M_node)->_M_storage)._M_storage + 0x20),
                       (AvailableModuleInfo *)&target_module_info);
            std::__cxx11::string::~string((string *)&target_mods_file);
            Json::Value::~Value(&target_modules);
            std::__cxx11::string::~string((string *)&target_module_info);
          }
          Json::ValueIteratorBase::increment((ValueIteratorBase *)&fmftn);
        }
      }
      pVVar12 = Json::Value::operator[](&ltm,"references");
      bVar11 = Json::Value::isObject(pVVar12);
      if (bVar11) {
        cVar30 = Json::Value::begin(pVVar12);
        fmftn._M_dataplus._M_p = (pointer)cVar30.super_ValueIteratorBase.current_._M_node;
        fmftn._M_string_length =
             CONCAT71(fmftn._M_string_length._1_7_,cVar30.super_ValueIteratorBase.isNull_);
        while( true ) {
          cVar30 = Json::Value::end(pVVar12);
          target_module_info.value_.int_ =
               (LargestInt)cVar30.super_ValueIteratorBase.current_._M_node;
          target_module_info.bits_._0_1_ = cVar30.super_ValueIteratorBase.isNull_;
          bVar11 = Json::ValueIteratorBase::operator!=
                             ((ValueIteratorBase *)&fmftn,(SelfType *)&target_module_info);
          if (!bVar11) break;
          pVVar13 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&fmftn);
          bVar11 = Json::Value::isObject(pVVar13);
          if (bVar11) {
            pVVar13 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&fmftn);
            pVVar13 = Json::Value::operator[](pVVar13,"path");
            target_module_info.value_.string_ = (char *)&target_module_info.comments_;
            target_module_info.bits_ = (anon_struct_4_2_14fb5ae2_for_bits_)0x0;
            target_module_info._12_4_ = 0;
            target_module_info.comments_.ptr_._M_t.
            super___uniq_ptr_impl<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_std::default_delete<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_>_>
            .
            super__Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
            ._M_head_impl._0_1_ = 0;
            bVar11 = Json::Value::isString(pVVar13);
            if (bVar11) {
              Json::Value::asString_abi_cxx11_((String *)&target_modules,pVVar13);
              std::__cxx11::string::operator=
                        ((string *)&target_module_info,(string *)&target_modules);
              std::__cxx11::string::~string((string *)&target_modules);
            }
            pVVar13 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&fmftn);
            pVVar13 = Json::Value::operator[](pVVar13,"lookup-method");
            bVar11 = Json::Value::isString(pVVar13);
            if (bVar11) {
              Json::Value::asString_abi_cxx11_((String *)&target_modules,pVVar13);
              bVar11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&target_modules,"by-name");
              uVar23 = 0;
              if (bVar11) {
LAB_00267da3:
                target_module_info.limit_ = CONCAT44(target_module_info.limit_._4_4_,uVar23);
              }
              else {
                bVar11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&target_modules,"include-angle");
                uVar23 = 1;
                if (bVar11) goto LAB_00267da3;
                bVar11 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&target_modules,"include-quote");
                uVar23 = 2;
                if (bVar11) goto LAB_00267da3;
              }
              std::__cxx11::string::~string((string *)&target_modules);
            }
            Json::ValueIteratorBase::key(&target_modules,(ValueIteratorBase *)&fmftn);
            Json::Value::asString_abi_cxx11_(&target_mods_file,&target_modules);
            this_00 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CxxModuleReference>_>_>
                      ::operator[](&usages.Reference,&target_mods_file);
            CxxModuleReference::operator=(this_00,(CxxModuleReference *)&target_module_info);
            std::__cxx11::string::~string((string *)&target_mods_file);
            Json::Value::~Value(&target_modules);
            std::__cxx11::string::~string((string *)&target_module_info);
          }
          Json::ValueIteratorBase::increment((ValueIteratorBase *)&fmftn);
        }
      }
      pVVar12 = Json::Value::operator[](&ltm,"usages");
      bVar11 = Json::Value::isObject(pVVar12);
      if (bVar11) {
        cVar30 = Json::Value::begin(pVVar12);
        fmftn._M_dataplus._M_p = (pointer)cVar30.super_ValueIteratorBase.current_._M_node;
        fmftn._M_string_length =
             CONCAT71(fmftn._M_string_length._1_7_,cVar30.super_ValueIteratorBase.isNull_);
        while( true ) {
          cVar30 = Json::Value::end(pVVar12);
          target_module_info.value_.int_ =
               (LargestInt)cVar30.super_ValueIteratorBase.current_._M_node;
          target_module_info.bits_._0_1_ = cVar30.super_ValueIteratorBase.isNull_;
          bVar11 = Json::ValueIteratorBase::operator!=
                             ((ValueIteratorBase *)&fmftn,(SelfType *)&target_module_info);
          if (!bVar11) break;
          pVVar13 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&fmftn);
          bVar11 = Json::Value::isArray(pVVar13);
          if (bVar11) {
            pVVar13 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&fmftn);
            cVar30 = Json::Value::begin(pVVar13);
            local_708._0_8_ = cVar30.super_ValueIteratorBase.current_._M_node;
            local_708[8] = cVar30.super_ValueIteratorBase.isNull_;
            while( true ) {
              pVVar13 = Json::ValueIteratorBase::deref((ValueIteratorBase *)&fmftn);
              cVar30 = Json::Value::end(pVVar13);
              target_module_info.value_.int_ =
                   (LargestInt)cVar30.super_ValueIteratorBase.current_._M_node;
              target_module_info.bits_._0_1_ = cVar30.super_ValueIteratorBase.isNull_;
              bVar11 = Json::ValueIteratorBase::operator!=
                                 ((ValueIteratorBase *)local_708,(SelfType *)&target_module_info);
              if (!bVar11) break;
              Json::ValueIteratorBase::key(&target_module_info,(ValueIteratorBase *)&fmftn);
              Json::Value::asString_abi_cxx11_((String *)&target_modules,&target_module_info);
              this_01 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                           ::operator[](&usages.Usage,(key_type *)&target_modules);
              pVVar13 = Json::ValueIteratorBase::deref((ValueIteratorBase *)local_708);
              Json::Value::asString_abi_cxx11_(&target_mods_file,pVVar13);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>(this_01,&target_mods_file);
              std::__cxx11::string::~string((string *)&target_mods_file);
              std::__cxx11::string::~string((string *)&target_modules);
              Json::Value::~Value(&target_module_info);
              Json::ValueIteratorBase::increment((ValueIteratorBase *)local_708);
            }
          }
          Json::ValueIteratorBase::increment((ValueIteratorBase *)&fmftn);
        }
      }
    }
  }
  else {
    Json::Reader::getFormattedErrorMessages_abi_cxx11_((String *)&target_modules,(Reader *)&tmf);
    cmStrCat<char_const(&)[39],std::__cxx11::string_const&,std::__cxx11::string>
              ((string *)&target_module_info,(char (*) [39])"-E cmake_ninja_dyndep failed to parse "
               ,pbVar26,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &target_modules);
    cmSystemTools::Error((string *)&target_module_info);
    std::__cxx11::string::~string((string *)&target_module_info);
    std::__cxx11::string::~string((string *)&target_modules);
  }
  Json::Reader::~Reader((Reader *)&tmf);
  std::ifstream::~ifstream(&ddf);
  Json::Value::~Value(&ltm);
  std::__cxx11::string::~string((string *)&ltmn);
  pbVar26 = pbVar26 + 1;
  if (!bVar10) goto LAB_00268005;
  goto LAB_0026790b;
LAB_00268005:
  bVar10 = false;
LAB_00268cb4:
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_AvailableModuleInfo>_>_>
  ::~map(&mod_files);
  CxxModuleUsage::~CxxModuleUsage(&usages);
LAB_00268cce:
  std::vector<cmScanDepInfo,_std::allocator<cmScanDepInfo>_>::~vector(&objects);
  return bVar10;
}

Assistant:

bool cmGlobalNinjaGenerator::WriteDyndepFile(
  std::string const& dir_top_src, std::string const& dir_top_bld,
  std::string const& dir_cur_src, std::string const& dir_cur_bld,
  std::string const& arg_dd, std::vector<std::string> const& arg_ddis,
  std::string const& module_dir,
  std::vector<std::string> const& linked_target_dirs,
  std::vector<std::string> const& forward_modules_from_target_dirs,
  std::string const& arg_lang, std::string const& arg_modmapfmt,
  cmCxxModuleExportInfo const& export_info)
{
  // Setup path conversions.
  {
    cmStateSnapshot snapshot = this->GetCMakeInstance()->GetCurrentSnapshot();
    snapshot.GetDirectory().SetCurrentSource(dir_cur_src);
    snapshot.GetDirectory().SetCurrentBinary(dir_cur_bld);
    auto mfd = cm::make_unique<cmMakefile>(this, snapshot);
    auto lgd = this->CreateLocalGenerator(mfd.get());
    lgd->SetRelativePathTop(dir_top_src, dir_top_bld);
    this->Makefiles.push_back(std::move(mfd));
    this->LocalGenerators.push_back(std::move(lgd));
  }

  std::vector<cmScanDepInfo> objects;
  for (std::string const& arg_ddi : arg_ddis) {
    cmScanDepInfo info;
    if (!cmScanDepFormat_P1689_Parse(arg_ddi, &info)) {
      cmSystemTools::Error(
        cmStrCat("-E cmake_ninja_dyndep failed to parse ddi file ", arg_ddi));
      return false;
    }
    objects.push_back(std::move(info));
  }

  CxxModuleUsage usages;

  // Map from module name to module file path, if known.
  struct AvailableModuleInfo
  {
    std::string BmiPath;
    bool IsPrivate;
  };
  std::map<std::string, AvailableModuleInfo> mod_files;

  // Populate the module map with those provided by linked targets first.
  for (std::string const& linked_target_dir : linked_target_dirs) {
    std::string const ltmn =
      cmStrCat(linked_target_dir, '/', arg_lang, "Modules.json");
    Json::Value ltm;
    cmsys::ifstream ltmf(ltmn.c_str(), std::ios::in | std::ios::binary);
    if (!ltmf) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to open ",
                                    ltmn, " for module information"));
      return false;
    }
    Json::Reader reader;
    if (!reader.parse(ltmf, ltm, false)) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    linked_target_dir,
                                    reader.getFormattedErrorMessages()));
      return false;
    }
    if (ltm.isObject()) {
      Json::Value const& target_modules = ltm["modules"];
      if (target_modules.isObject()) {
        for (auto i = target_modules.begin(); i != target_modules.end(); ++i) {
          Json::Value const& visible_module = *i;
          if (visible_module.isObject()) {
            Json::Value const& bmi_path = visible_module["bmi"];
            Json::Value const& is_private = visible_module["is-private"];
            mod_files[i.key().asString()] = AvailableModuleInfo{
              bmi_path.asString(),
              is_private.asBool(),
            };
          }
        }
      }
      Json::Value const& target_modules_references = ltm["references"];
      if (target_modules_references.isObject()) {
        for (auto i = target_modules_references.begin();
             i != target_modules_references.end(); ++i) {
          if (i->isObject()) {
            Json::Value const& reference_path = (*i)["path"];
            CxxModuleReference module_reference;
            if (reference_path.isString()) {
              module_reference.Path = reference_path.asString();
            }
            Json::Value const& reference_method = (*i)["lookup-method"];
            if (reference_method.isString()) {
              std::string reference = reference_method.asString();
              if (reference == "by-name") {
                module_reference.Method = LookupMethod::ByName;
              } else if (reference == "include-angle") {
                module_reference.Method = LookupMethod::IncludeAngle;
              } else if (reference == "include-quote") {
                module_reference.Method = LookupMethod::IncludeQuote;
              }
            }
            usages.Reference[i.key().asString()] = module_reference;
          }
        }
      }
      Json::Value const& target_modules_usage = ltm["usages"];
      if (target_modules_usage.isObject()) {
        for (auto i = target_modules_usage.begin();
             i != target_modules_usage.end(); ++i) {
          if (i->isArray()) {
            for (auto j = i->begin(); j != i->end(); ++j) {
              usages.Usage[i.key().asString()].insert(j->asString());
            }
          }
        }
      }
    }
  }

  cm::optional<CxxModuleMapFormat> modmap_fmt;
  if (arg_modmapfmt.empty()) {
    // nothing to do.
  } else if (arg_modmapfmt == "clang") {
    modmap_fmt = CxxModuleMapFormat::Clang;
  } else if (arg_modmapfmt == "gcc") {
    modmap_fmt = CxxModuleMapFormat::Gcc;
  } else if (arg_modmapfmt == "msvc") {
    modmap_fmt = CxxModuleMapFormat::Msvc;
  } else {
    cmSystemTools::Error(
      cmStrCat("-E cmake_ninja_dyndep does not understand the ", arg_modmapfmt,
               " module map format"));
    return false;
  }

  auto module_ext = CxxModuleMapExtension(modmap_fmt);

  // Extend the module map with those provided by this target.
  // We do this after loading the modules provided by linked targets
  // in case we have one of the same name that must be preferred.
  Json::Value target_modules = Json::objectValue;
  for (cmScanDepInfo const& object : objects) {
    for (auto const& p : object.Provides) {
      std::string mod;
      if (cmDyndepCollation::IsBmiOnly(export_info, object.PrimaryOutput)) {
        mod = object.PrimaryOutput;
      } else if (!p.CompiledModulePath.empty()) {
        // The scanner provided the path to the module file.
        mod = p.CompiledModulePath;
        if (!cmSystemTools::FileIsFullPath(mod)) {
          // Treat relative to work directory (top of build tree).
          mod = cmSystemTools::CollapseFullPath(mod, dir_top_bld);
        }
      } else {
        // Assume the module file path matches the logical module name.
        std::string safe_logical_name =
          p.LogicalName; // TODO: needs fixing for header units
        cmSystemTools::ReplaceString(safe_logical_name, ":", "-");
        mod = cmStrCat(module_dir, safe_logical_name, module_ext);
      }
      mod_files[p.LogicalName] = AvailableModuleInfo{
        mod,
        false, // Always visible within our own target.
      };
      Json::Value& module_info = target_modules[p.LogicalName] =
        Json::objectValue;
      module_info["bmi"] = mod;
      module_info["is-private"] =
        cmDyndepCollation::IsObjectPrivate(object.PrimaryOutput, export_info);
    }
  }

  cmGeneratedFileStream ddf(arg_dd);
  ddf << "ninja_dyndep_version = 1.0\n";

  {
    CxxModuleLocations locs;
    locs.RootDirectory = ".";
    locs.PathForGenerator = [this](std::string path) -> std::string {
      path = this->ConvertToNinjaPath(path);
#  ifdef _WIN32
      if (this->IsGCCOnWindows()) {
        std::replace(path.begin(), path.end(), '\\', '/');
      }
#  endif
      return path;
    };
    locs.BmiLocationForModule =
      [&mod_files](std::string const& logical) -> CxxBmiLocation {
      auto m = mod_files.find(logical);
      if (m != mod_files.end()) {
        if (m->second.IsPrivate) {
          return CxxBmiLocation::Private();
        }
        return CxxBmiLocation::Known(m->second.BmiPath);
      }
      return CxxBmiLocation::Unknown();
    };

    // Insert information about the current target's modules.
    if (modmap_fmt) {
      bool private_usage_found = false;
      auto cycle_modules =
        CxxModuleUsageSeed(locs, objects, usages, private_usage_found);
      if (!cycle_modules.empty()) {
        cmSystemTools::Error(
          cmStrCat("Circular dependency detected in the C++ module import "
                   "graph. See modules named: \"",
                   cmJoin(cycle_modules, R"(", ")"_s), '"'));
        return false;
      }
      if (private_usage_found) {
        // Already errored in the function.
        return false;
      }
    }

    cmNinjaBuild build("dyndep");
    build.Outputs.emplace_back("");
    for (cmScanDepInfo const& object : objects) {
      build.Outputs[0] = this->ConvertToNinjaPath(object.PrimaryOutput);
      build.ImplicitOuts.clear();
      for (auto const& p : object.Provides) {
        auto const implicitOut =
          this->ConvertToNinjaPath(mod_files[p.LogicalName].BmiPath);
        // Ignore the `provides` when the BMI is the output.
        if (implicitOut != build.Outputs[0]) {
          build.ImplicitOuts.emplace_back(implicitOut);
        }
      }
      build.ImplicitDeps.clear();
      for (auto const& r : object.Requires) {
        auto mit = mod_files.find(r.LogicalName);
        if (mit != mod_files.end()) {
          build.ImplicitDeps.push_back(
            this->ConvertToNinjaPath(mit->second.BmiPath));
        }
      }
      build.Variables.clear();
      if (!object.Provides.empty()) {
        build.Variables.emplace("restat", "1");
      }

      if (modmap_fmt) {
        auto mm = CxxModuleMapContent(*modmap_fmt, locs, object, usages);

        // XXX(modmap): If changing this path construction, change
        // `cmNinjaTargetGenerator::WriteObjectBuildStatements` and
        // `cmNinjaTargetGenerator::ExportObjectCompileCommand` to generate the
        // corresponding file path.
        cmGeneratedFileStream mmf(cmStrCat(object.PrimaryOutput, ".modmap"));
        mmf.SetCopyIfDifferent(true);
        mmf << mm;
      }

      this->WriteBuild(ddf, build);
    }
  }

  Json::Value target_module_info = Json::objectValue;
  target_module_info["modules"] = target_modules;

  auto& target_usages = target_module_info["usages"] = Json::objectValue;
  for (auto const& u : usages.Usage) {
    auto& mod_usage = target_usages[u.first] = Json::arrayValue;
    for (auto const& v : u.second) {
      mod_usage.append(v);
    }
  }

  auto name_for_method = [](LookupMethod method) -> cm::static_string_view {
    switch (method) {
      case LookupMethod::ByName:
        return "by-name"_s;
      case LookupMethod::IncludeAngle:
        return "include-angle"_s;
      case LookupMethod::IncludeQuote:
        return "include-quote"_s;
    }
    assert(false && "unsupported lookup method");
    return ""_s;
  };

  auto& target_references = target_module_info["references"] =
    Json::objectValue;
  for (auto const& r : usages.Reference) {
    auto& mod_ref = target_references[r.first] = Json::objectValue;
    mod_ref["path"] = r.second.Path;
    mod_ref["lookup-method"] = std::string(name_for_method(r.second.Method));
  }

  // Store the map of modules provided by this target in a file for
  // use by dependents that reference this target in linked-target-dirs.
  std::string const target_mods_file = cmStrCat(
    cmSystemTools::GetFilenamePath(arg_dd), '/', arg_lang, "Modules.json");

  // Populate the module map with those provided by linked targets first.
  for (std::string const& forward_modules_from_target_dir :
       forward_modules_from_target_dirs) {
    std::string const fmftn =
      cmStrCat(forward_modules_from_target_dir, '/', arg_lang, "Modules.json");
    Json::Value fmft;
    cmsys::ifstream fmftf(fmftn.c_str(), std::ios::in | std::ios::binary);
    if (!fmftf) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to open ",
                                    fmftn, " for module information"));
      return false;
    }
    Json::Reader reader;
    if (!reader.parse(fmftf, fmft, false)) {
      cmSystemTools::Error(cmStrCat("-E cmake_ninja_dyndep failed to parse ",
                                    forward_modules_from_target_dir,
                                    reader.getFormattedErrorMessages()));
      return false;
    }
    if (!fmft.isObject()) {
      continue;
    }

    auto forward_info = [](Json::Value& target, Json::Value const& source) {
      if (!source.isObject()) {
        return;
      }

      for (auto i = source.begin(); i != source.end(); ++i) {
        std::string const key = i.key().asString();
        if (target.isMember(key)) {
          continue;
        }
        target[key] = *i;
      }
    };

    // Forward info from forwarding targets into our collation.
    Json::Value& tmi_target_modules = target_module_info["modules"];
    forward_info(tmi_target_modules, fmft["modules"]);
    forward_info(target_references, fmft["references"]);
    forward_info(target_usages, fmft["usages"]);
  }

  cmGeneratedFileStream tmf(target_mods_file);
  tmf.SetCopyIfDifferent(true);
  tmf << target_module_info;

  cmDyndepMetadataCallbacks cb;
  cb.ModuleFile =
    [mod_files](std::string const& name) -> cm::optional<std::string> {
    auto m = mod_files.find(name);
    if (m != mod_files.end()) {
      return m->second.BmiPath;
    }
    return {};
  };

  return cmDyndepCollation::WriteDyndepMetadata(arg_lang, objects, export_info,
                                                cb);
}